

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O1

void __thiscall
chrono::ChVisualShapeFEA::UpdateBuffers_Hex
          (ChVisualShapeFEA *this,shared_ptr<chrono::fea::ChElementBase> *element,
          ChTriangleMeshConnected *trianglemesh,uint *i_verts,uint *i_vnorms,uint *i_vcols,
          uint *i_triindex)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pCVar4;
  pointer pCVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ChVisualShapeFEA *pCVar10;
  int iVar11;
  int iVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 *puVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long *plVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ChVector<double> pt [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> nodes [8];
  undefined1 local_1d8 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_1a0;
  ulong local_190;
  uint *local_188;
  double local_180 [2];
  undefined1 auStack_170 [8];
  undefined8 uStack_168;
  element_type *peStack_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_158;
  element_type *peStack_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_148;
  pointer piStack_140;
  pointer local_138;
  pointer piStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  long alStack_c0 [18];
  
  local_180[0] = (double)(ulong)*i_verts;
  local_190 = (ulong)*i_vnorms;
  plVar20 = alStack_c0 + 1;
  alStack_c0[9] = 0;
  alStack_c0[10] = 0;
  alStack_c0[0xb] = 0;
  alStack_c0[0xc] = 0;
  alStack_c0[0xd] = 0;
  alStack_c0[0xe] = 0;
  alStack_c0[0xf] = 0;
  alStack_c0[0x10] = 0;
  alStack_c0[1] = 0;
  alStack_c0[2] = 0;
  alStack_c0[3] = 0;
  alStack_c0[4] = 0;
  alStack_c0[5] = 0;
  alStack_c0[6] = 0;
  alStack_c0[7] = 0;
  alStack_c0[8] = 0;
  puVar15 = &uStack_168;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  alStack_c0[0] = 0;
  local_138 = (pointer)0x0;
  piStack_130 = (pointer)0x0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  local_180[1] = 0.0;
  auStack_170._0_4_ = 0.0;
  auStack_170._4_4_ = 0.0;
  uStack_168._0_4_ = 0.0;
  uStack_168._4_4_ = 0;
  peStack_160 = (element_type *)0x0;
  _Stack_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_150 = (element_type *)0x0;
  _Stack_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piStack_140 = (pointer)0x0;
  uVar14 = 0;
  local_1d8._24_8_ = i_vcols;
  local_1d8._32_8_ = element;
  local_188 = i_vnorms;
  do {
    peVar3 = ((__shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2> *)
             local_1d8._32_8_)->_M_ptr;
    (*peVar3->_vptr_ChElementBase[5])((ChVisualShapeFEA *)local_1d8,peVar3,uVar14 & 0xffffffff);
    lVar9 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
    if (lVar9 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar9 + 8) = *(int *)(lVar9 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar9 + 8) = *(int *)(lVar9 + 8) + 1;
      }
    }
    *plVar20 = CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar20[1];
    plVar20[1] = lVar9;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_)
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_1d8._12_4_,local_1d8._8_4_));
    }
    if (this->undeformed_reference == false) {
      lVar9 = *plVar20;
      puVar15[-2] = *(undefined8 *)(lVar9 + 0x20);
      puVar15[-1] = *(undefined8 *)(lVar9 + 0x28);
      uVar13 = *(undefined8 *)(lVar9 + 0x30);
    }
    else {
      (**(code **)(*(long *)*plVar20 + 0x60))((ChVisualShapeFEA *)local_1d8);
      puVar15[-2] = CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
      puVar15[-1] = CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
      uVar13 = local_1d8._16_8_;
    }
    *puVar15 = uVar13;
    uVar14 = uVar14 + 1;
    puVar15 = puVar15 + 3;
    plVar20 = plVar20 + 2;
  } while (uVar14 != 8);
  if (this->shrink_elements == true) {
    dVar23 = 0.0;
    lVar9 = 0x10;
    dVar22 = 0.0;
    dVar21 = 0.0;
    do {
      dVar21 = dVar21 + *(double *)((long)&local_188 + lVar9);
      dVar22 = dVar22 + *(double *)((long)local_180 + lVar9);
      dVar23 = dVar23 + *(double *)((long)local_180 + lVar9 + 8);
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0xd0);
    dVar1 = this->shrink_factor;
    lVar9 = 0x10;
    do {
      dVar2 = *(double *)((long)local_180 + lVar9 + 8);
      *(double *)((long)&local_188 + lVar9) =
           dVar21 * 0.125 + dVar1 * (*(double *)((long)&local_188 + lVar9) - dVar21 * 0.125);
      *(double *)((long)local_180 + lVar9) =
           dVar22 * 0.125 + dVar1 * (*(double *)((long)local_180 + lVar9) - dVar22 * 0.125);
      *(double *)((long)local_180 + lVar9 + 8) = dVar23 * 0.125 + (dVar2 - dVar23 * 0.125) * dVar1;
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0xd0);
  }
  pCVar4 = (trianglemesh->m_vertices).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = *i_verts;
  lVar9 = 0x10;
  do {
    pCVar4[uVar7].m_data[0] = *(double *)((long)&local_188 + lVar9);
    pCVar4[uVar7].m_data[1] = *(double *)((long)local_180 + lVar9);
    pCVar4[uVar7].m_data[2] = *(double *)((long)local_180 + lVar9 + 8);
    uVar7 = uVar7 + 1;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0xd0);
  *i_verts = uVar7;
  lVar9 = 0;
  uVar13 = 0xd0;
  do {
    local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)((long)alStack_c0 + lVar9 + 8);
    local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)alStack_c0 + lVar9 + 0x10);
    if (local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1d8._40_8_ =
         ((__shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2> *)local_1d8._32_8_)
         ->_M_ptr;
    local_1a8 = (((__shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2> *)
                 local_1d8._32_8_)->_M_refcount)._M_pi;
    if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_1a8->_M_use_count = local_1a8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_1a8->_M_use_count = local_1a8->_M_use_count + 1;
      }
    }
    dVar21 = ComputeScalarOutput(this,&local_1a0,(int)uVar13,
                                 (shared_ptr<chrono::fea::ChElementBase> *)(local_1d8 + 0x28));
    ComputeFalseColor((ChVisualShapeFEA *)local_1d8,dVar21);
    pCVar10 = (ChVisualShapeFEA *)
              ((trianglemesh->m_colors).
               super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
               super__Vector_impl_data._M_start + *(uint *)local_1d8._24_8_);
    if ((ChVisualShapeFEA *)local_1d8 != pCVar10) {
      *(undefined4 *)
       &(pCVar10->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_1d8._0_4_;
      *(undefined4 *)
       ((long)&(pCVar10->FEMmesh).
               super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
           local_1d8._4_4_;
      *(undefined4 *)
       &(pCVar10->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_1d8._8_4_;
    }
    uVar13 = extraout_RDX;
    if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
      uVar13 = extraout_RDX_00;
    }
    if (local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      uVar13 = extraout_RDX_01;
    }
    *(uint *)local_1d8._24_8_ = *(uint *)local_1d8._24_8_ + 1;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x80);
  iVar6 = SUB84(local_180[0],0);
  iVar8 = iVar6 + 2;
  iVar11 = iVar6 + 1;
  uVar7 = *i_triindex;
  pCVar5 = (trianglemesh->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar5[uVar7].m_data[0] = iVar6;
  pCVar5[uVar7].m_data[1] = iVar8;
  pCVar5[uVar7].m_data[2] = iVar11;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  iVar17 = iVar6 + 3;
  pCVar5[uVar7].m_data[0] = iVar6;
  pCVar5[uVar7].m_data[1] = iVar17;
  pCVar5[uVar7].m_data[2] = iVar8;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  iVar19 = iVar6 + 4;
  iVar12 = iVar6 + 5;
  iVar16 = iVar6 + 6;
  pCVar5[uVar7].m_data[0] = iVar19;
  pCVar5[uVar7].m_data[1] = iVar12;
  pCVar5[uVar7].m_data[2] = iVar16;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  iVar18 = iVar6 + 7;
  pCVar5[uVar7].m_data[0] = iVar19;
  pCVar5[uVar7].m_data[1] = iVar16;
  pCVar5[uVar7].m_data[2] = iVar18;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  pCVar5[uVar7].m_data[0] = iVar6;
  pCVar5[uVar7].m_data[1] = iVar18;
  pCVar5[uVar7].m_data[2] = iVar17;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  pCVar5[uVar7].m_data[0] = iVar6;
  pCVar5[uVar7].m_data[1] = iVar19;
  pCVar5[uVar7].m_data[2] = iVar18;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  pCVar5 = (trianglemesh->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar5[uVar7].m_data[0] = iVar6;
  pCVar5[uVar7].m_data[1] = iVar12;
  pCVar5[uVar7].m_data[2] = iVar19;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  pCVar5[uVar7].m_data[0] = iVar6;
  pCVar5[uVar7].m_data[1] = iVar11;
  pCVar5[uVar7].m_data[2] = iVar12;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  pCVar5[uVar7].m_data[0] = iVar17;
  pCVar5[uVar7].m_data[1] = iVar18;
  pCVar5[uVar7].m_data[2] = iVar16;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  pCVar5[uVar7].m_data[0] = iVar17;
  pCVar5[uVar7].m_data[1] = iVar16;
  pCVar5[uVar7].m_data[2] = iVar8;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  pCVar5[uVar7].m_data[0] = iVar8;
  pCVar5[uVar7].m_data[1] = iVar12;
  pCVar5[uVar7].m_data[2] = iVar11;
  uVar7 = *i_triindex + 1;
  *i_triindex = uVar7;
  pCVar5[uVar7].m_data[0] = iVar8;
  pCVar5[uVar7].m_data[1] = iVar16;
  pCVar5[uVar7].m_data[2] = iVar12;
  uVar7 = *i_triindex;
  *i_triindex = uVar7 + 1;
  if (this->smooth_faces != false) {
    iVar6 = (int)local_190;
    pCVar5 = (trianglemesh->m_face_n_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = uVar7 - 0xb;
    pCVar5[uVar7].m_data[0] = iVar6;
    pCVar5[uVar7].m_data[1] = iVar6 + 2;
    pCVar5[uVar7].m_data[2] = iVar6 + 1;
    uVar7 = *i_triindex - 0xb;
    pCVar5[uVar7].m_data[0] = iVar6;
    pCVar5[uVar7].m_data[1] = iVar6 + 3;
    pCVar5[uVar7].m_data[2] = iVar6 + 2;
    uVar7 = *i_triindex - 10;
    pCVar5[uVar7].m_data[0] = iVar6 + 4;
    pCVar5[uVar7].m_data[1] = iVar6 + 5;
    pCVar5[uVar7].m_data[2] = iVar6 + 6;
    uVar7 = *i_triindex - 9;
    pCVar5[uVar7].m_data[0] = iVar6 + 4;
    pCVar5[uVar7].m_data[1] = iVar6 + 6;
    pCVar5[uVar7].m_data[2] = iVar6 + 7;
    uVar7 = *i_triindex - 8;
    pCVar5[uVar7].m_data[0] = iVar6 + 8;
    pCVar5[uVar7].m_data[1] = iVar6 + 9;
    pCVar5[uVar7].m_data[2] = iVar6 + 10;
    uVar7 = *i_triindex - 7;
    pCVar5[uVar7].m_data[0] = iVar6 + 8;
    pCVar5[uVar7].m_data[1] = iVar6 + 0xb;
    pCVar5[uVar7].m_data[2] = iVar6 + 9;
    pCVar5 = (trianglemesh->m_face_n_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = *i_triindex - 6;
    pCVar5[uVar7].m_data[0] = iVar6 + 0xc;
    pCVar5[uVar7].m_data[1] = iVar6 + 0xd;
    pCVar5[uVar7].m_data[2] = iVar6 + 0xe;
    uVar7 = *i_triindex - 5;
    pCVar5[uVar7].m_data[0] = iVar6 + 0xc;
    pCVar5[uVar7].m_data[1] = iVar6 + 0xf;
    pCVar5[uVar7].m_data[2] = iVar6 + 0xd;
    uVar7 = *i_triindex - 4;
    pCVar5[uVar7].m_data[0] = iVar6 + 0x10;
    pCVar5[uVar7].m_data[1] = iVar6 + 0x12;
    pCVar5[uVar7].m_data[2] = iVar6 + 0x11;
    uVar7 = *i_triindex - 3;
    pCVar5[uVar7].m_data[0] = iVar6 + 0x10;
    pCVar5[uVar7].m_data[1] = iVar6 + 0x11;
    pCVar5[uVar7].m_data[2] = iVar6 + 0x13;
    uVar7 = *i_triindex - 2;
    pCVar5[uVar7].m_data[0] = iVar6 + 0x14;
    pCVar5[uVar7].m_data[1] = iVar6 + 0x15;
    pCVar5[uVar7].m_data[2] = iVar6 + 0x17;
    uVar7 = *i_triindex - 1;
    pCVar5[uVar7].m_data[0] = iVar6 + 0x14;
    pCVar5[uVar7].m_data[1] = iVar6 + 0x16;
    pCVar5[uVar7].m_data[2] = iVar6 + 0x15;
    *local_188 = *local_188 + 0x18;
  }
  lVar9 = 0x80;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)alStack_c0 + lVar9) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)alStack_c0 + lVar9));
    }
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != 0);
  return;
}

Assistant:

void ChVisualShapeFEA::UpdateBuffers_Hex(std::shared_ptr<ChElementBase> element,
                                         geometry::ChTriangleMeshConnected& trianglemesh,
                                         unsigned int& i_verts,
                                         unsigned int& i_vnorms,
                                         unsigned int& i_vcols,
                                         unsigned int& i_triindex) {
    unsigned int ivert_el = i_verts;
    unsigned int inorm_el = i_vnorms;

    std::shared_ptr<ChNodeFEAxyz> nodes[8];
    ChVector<> pt[8];

    for (int in = 0; in < 8; ++in) {
        nodes[in] = std::static_pointer_cast<ChNodeFEAxyz>(element->GetNodeN(in));
        if (!undeformed_reference)
            pt[in] = nodes[in]->GetPos();
        else
            pt[in] = nodes[in]->GetX0();
    }

    // vertexes

    if (shrink_elements) {
        ChVector<> vc(0, 0, 0);
        for (int in = 0; in < 8; ++in)
            vc += pt[in];
        vc = vc * (1.0 / 8.0);  // average, center of element
        for (int in = 0; in < 8; ++in)
            pt[in] = vc + shrink_factor * (pt[in] - vc);
    }

    for (int in = 0; in < 8; ++in) {
        trianglemesh.getCoordsVertices()[i_verts] = pt[in];
        ++i_verts;
    }

    // colours and colours indexes
    for (int in = 0; in < 8; ++in) {
        trianglemesh.getCoordsColors()[i_vcols] = ComputeFalseColor(ComputeScalarOutput(nodes[in], in, element));
        ++i_vcols;
    }

    // faces indexes
    ChVector<int> ivert_offset(ivert_el, ivert_el, ivert_el);
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 2, 1) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 3, 2) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(4, 5, 6) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(4, 6, 7) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 7, 3) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 4, 7) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 5, 4) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 1, 5) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(3, 7, 6) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(3, 6, 2) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(2, 5, 1) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(2, 6, 5) + ivert_offset;
    ++i_triindex;

    // normals indices (if not defaulting to flat triangles)
    if (smooth_faces) {
        ChVector<int> inorm_offset = ChVector<int>(inorm_el, inorm_el, inorm_el);
        trianglemesh.getIndicesNormals()[i_triindex - 12] = ChVector<int>(0, 2, 1) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 11] = ChVector<int>(0, 3, 2) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 10] = ChVector<int>(4, 5, 6) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 9] = ChVector<int>(4, 6, 7) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 8] = ChVector<int>(8, 9, 10) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 7] = ChVector<int>(8, 11, 9) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 6] = ChVector<int>(12, 13, 14) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 5] = ChVector<int>(12, 15, 13) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 4] = ChVector<int>(16, 18, 17) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 3] = ChVector<int>(16, 17, 19) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 2] = ChVector<int>(20, 21, 23) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 1] = ChVector<int>(20, 22, 21) + inorm_offset;
        i_vnorms += 24;
    }
}